

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_avx2.h
# Opt level: O0

void xy_x_2tap_32_avx2(uint8_t *src,__m256i *coeffs,int16_t *dst)

{
  __m256i src_00;
  __m256i src_01;
  __m256i *in_RDX;
  uint8_t *in_RSI;
  __m256i d1;
  __m256i d0;
  __m256i r [2];
  undefined8 in_stack_fffffffffffffef8;
  longlong in_stack_ffffffffffffff00;
  longlong lVar1;
  longlong in_stack_ffffffffffffff08;
  longlong lVar2;
  longlong in_stack_ffffffffffffff10;
  longlong lVar3;
  longlong lStack_e8;
  longlong local_e0;
  longlong lStack_d8;
  longlong lStack_d0;
  longlong lStack_c8;
  __m256i *in_stack_ffffffffffffff40;
  
  xy_x_convolve_2tap_32_avx2(in_RSI,in_RDX,in_stack_ffffffffffffff40);
  src_00[1] = in_stack_ffffffffffffff00;
  src_00[0] = in_stack_fffffffffffffef8;
  src_00[2] = in_stack_ffffffffffffff08;
  src_00[3] = in_stack_ffffffffffffff10;
  lVar1 = in_stack_ffffffffffffff00;
  lVar2 = in_stack_ffffffffffffff08;
  lVar3 = in_stack_ffffffffffffff10;
  xy_x_round_avx2(src_00);
  src_01[1] = lVar1;
  src_01[0] = lStack_e8;
  src_01[2] = lVar2;
  src_01[3] = lVar3;
  xy_x_round_avx2(src_01);
  (*in_RDX)[0] = in_stack_ffffffffffffff00;
  (*in_RDX)[1] = in_stack_ffffffffffffff08;
  (*in_RDX)[2] = in_stack_ffffffffffffff10;
  (*in_RDX)[3] = lStack_e8;
  in_RDX[1][0] = local_e0;
  in_RDX[1][1] = lStack_d8;
  in_RDX[1][2] = lStack_d0;
  in_RDX[1][3] = lStack_c8;
  return;
}

Assistant:

static inline void xy_x_2tap_32_avx2(const uint8_t *const src,
                                     const __m256i coeffs[1],
                                     int16_t *const dst) {
  __m256i r[2];

  xy_x_convolve_2tap_32_avx2(src, coeffs, r);
  const __m256i d0 = xy_x_round_avx2(r[0]);
  const __m256i d1 = xy_x_round_avx2(r[1]);
  _mm256_storeu_si256((__m256i *)dst, d0);
  _mm256_storeu_si256((__m256i *)(dst + 16), d1);
}